

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 VmHashmapInsert(jx9_hashmap *pMap,char *zKey,int nKeylen,char *zData,int nLen)

{
  sxi32 sVar1;
  jx9_value *pObj;
  jx9_value sValue;
  jx9_value sKey;
  jx9_value local_b0;
  jx9_value local_70;
  
  jx9MemObjInit(pMap->pVm,&local_70);
  pObj = (jx9_value *)0x0;
  jx9MemObjInitFromString(pMap->pVm,&local_b0,(SyString *)0x0);
  if (zKey != (char *)0x0) {
    if (nKeylen < 0) {
      nKeylen = SyStrlen(zKey);
    }
    pObj = &local_70;
    jx9MemObjStringAppend(pObj,zKey,nKeylen);
  }
  if (zData != (char *)0x0) {
    if (nLen < 0) {
      nLen = SyStrlen(zData);
    }
    jx9MemObjStringAppend(&local_b0,zData,nLen);
  }
  sVar1 = HashmapInsert(pMap,pObj,&local_b0);
  jx9MemObjRelease(&local_70);
  jx9MemObjRelease(&local_b0);
  return sVar1;
}

Assistant:

static sxi32 VmHashmapInsert(
	jx9_hashmap *pMap,  /* Target hashmap  */
	const char *zKey,   /* Entry key */
	int nKeylen,        /* zKey length*/
	const char *zData,  /* Entry data */
	int nLen            /* zData length */
	)
{
	jx9_value sKey,sValue;
	jx9_value *pKey;
	sxi32 rc;
	pKey = 0;
	jx9MemObjInit(pMap->pVm, &sKey);
	jx9MemObjInitFromString(pMap->pVm, &sValue, 0);
	if( zKey ){
		if( nKeylen < 0 ){
			nKeylen = (int)SyStrlen(zKey);
		}
		jx9MemObjStringAppend(&sKey, zKey, (sxu32)nKeylen);
		pKey = &sKey;
	}
	if( zData ){
		if( nLen < 0 ){
			/* Compute length automatically */
			nLen = (int)SyStrlen(zData);
		}
		jx9MemObjStringAppend(&sValue, zData, (sxu32)nLen);
	}
	/* Perform the insertion */
	rc = jx9HashmapInsert(&(*pMap),pKey,&sValue);
	jx9MemObjRelease(&sKey);
	jx9MemObjRelease(&sValue);
	return rc;
}